

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O3

bool picojson::
     _parse<picojson::default_parse_context,boost::asio::buffers_iterator<boost::asio::const_buffer,char>>
               (default_parse_context *ctx,
               input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *in)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  lconv *plVar4;
  FILE *__stream;
  FILE *__stream_00;
  FILE *__stream_01;
  size_t sVar5;
  double f;
  string num_str;
  char *endp;
  string local_58;
  char *local_38;
  
  __stream_01 = (FILE *)in;
  input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::skip_ws(in);
  iVar3 = input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::getc
                    (in,__stream_01);
  if (iVar3 < 0x6e) {
    if (iVar3 == 0x22) {
      bVar2 = default_parse_context::
              parse_string<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>(ctx,in);
      return bVar2;
    }
    if (iVar3 == 0x5b) {
      bVar2 = default_parse_context::parse_array_start(ctx);
      if (!bVar2) {
        return false;
      }
      bVar2 = input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::expect
                        (in,0x5d);
      if (bVar2) {
        return true;
      }
      sVar5 = 0;
      do {
        bVar2 = default_parse_context::
                parse_array_item<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>
                          (ctx,in,sVar5);
        if (!bVar2) {
          return false;
        }
        sVar5 = sVar5 + 1;
        bVar2 = input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::expect
                          (in,0x2c);
      } while (bVar2);
      bVar2 = input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::expect
                        (in,0x5d);
      return bVar2;
    }
    if (iVar3 != 0x66) {
LAB_0016a833:
      if (iVar3 != 0x2d && 9 < iVar3 - 0x30U) {
        input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::ungetc
                  (in,(int)__stream_01,__stream);
        return false;
      }
      input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::ungetc
                (in,(int)__stream_01,__stream);
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity._0_4_ =
           local_58.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
LAB_0016a877:
      do {
        iVar3 = input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::getc
                          (in,__stream_01);
        if (9 < iVar3 - 0x30U) {
          uVar1 = iVar3 - 0x2b;
          if (0x3a < uVar1) {
LAB_0016a9aa:
            input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::ungetc
                      (in,(int)__stream_01,__stream_00);
            if ((local_58._M_string_length == 0) ||
               (f = strtod(local_58._M_dataplus._M_p,&local_38),
               local_38 != local_58._M_dataplus._M_p + local_58._M_string_length)) {
              bVar2 = false;
            }
            else {
              default_parse_context::set_number(ctx,f);
              bVar2 = true;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p == &local_58.field_2) {
              return bVar2;
            }
            operator_delete(local_58._M_dataplus._M_p);
            return bVar2;
          }
          if ((0x400000004000005U >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
            if ((ulong)uVar1 != 3) goto LAB_0016a9aa;
            plVar4 = localeconv();
            __stream_01 = (FILE *)plVar4->decimal_point;
            std::__cxx11::string::append((char *)&local_58);
            goto LAB_0016a877;
          }
        }
        __stream_01 = (FILE *)(ulong)(uint)(int)(char)iVar3;
        std::__cxx11::string::push_back((char)&local_58);
      } while( true );
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58.field_2._M_allocated_capacity._0_4_ = 0x65736c61;
    local_58._M_string_length = 4;
    local_58.field_2._M_local_buf[4] = '\0';
    bVar2 = input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::match
                      (in,&local_58);
    if (!bVar2) goto LAB_0016a97f;
    bVar2 = default_parse_context::set_bool(ctx,false);
  }
  else {
    if (iVar3 == 0x7b) {
      bVar2 = _parse_object<picojson::default_parse_context,boost::asio::buffers_iterator<boost::asio::const_buffer,char>>
                        (ctx,in);
      return bVar2;
    }
    if (iVar3 == 0x74) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_58.field_2._M_allocated_capacity._0_4_ = 0x657572;
      local_58._M_string_length = 3;
      bVar2 = input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::match
                        (in,&local_58);
      if (!bVar2) {
LAB_0016a97f:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
          return false;
        }
        return false;
      }
      bVar2 = default_parse_context::set_bool(ctx,true);
    }
    else {
      if (iVar3 != 0x6e) goto LAB_0016a833;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_58.field_2._M_allocated_capacity._0_4_ = 0x6c6c75;
      local_58._M_string_length = 3;
      bVar2 = input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::match
                        (in,&local_58);
      if (!bVar2) goto LAB_0016a97f;
      bVar2 = default_parse_context::set_null(ctx);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (bVar2 == false) {
    return false;
  }
  return true;
}

Assistant:

inline bool _parse(Context& ctx, input<Iter>& in) {
    in.skip_ws();
    int ch = in.getc();
    switch (ch) {
#define IS(ch, text, op) case ch: \
      if (in.match(text) && op) { \
	return true; \
      } else { \
	return false; \
      }
      IS('n', "ull", ctx.set_null());
      IS('f', "alse", ctx.set_bool(false));
      IS('t', "rue", ctx.set_bool(true));
#undef IS
    case '"':
      return ctx.parse_string(in);
    case '[':
      return _parse_array(ctx, in);
    case '{':
      return _parse_object(ctx, in);
    default:
      if (('0' <= ch && ch <= '9') || ch == '-') {
        double f;
        char *endp;
	in.ungetc();
        std::string num_str = _parse_number(in);
        if (num_str.empty()) {
          return false;
        }
#ifdef PICOJSON_USE_INT64
        {
          errno = 0;
          intmax_t ival = strtoimax(num_str.c_str(), &endp, 10);
          if (errno == 0
              && std::numeric_limits<int64_t>::min() <= ival
              && ival <= std::numeric_limits<int64_t>::max()
              && endp == num_str.c_str() + num_str.size()) {
            ctx.set_int64(ival);
            return true;
          }
        }
#endif
        f = strtod(num_str.c_str(), &endp);
        if (endp == num_str.c_str() + num_str.size()) {
          ctx.set_number(f);
          return true;
        }
        return false;
      }
      break;
    }
    in.ungetc();
    return false;
  }